

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbr2_sender.cc
# Opt level: O0

void __thiscall
quic::Bbr2Sender::OnCongestionEvent
          (Bbr2Sender *this,bool param_1,QuicByteCount prior_in_flight,QuicTime event_time,
          AckedPacketVector *acked_packets,LostPacketVector *lost_packets)

{
  Bbr2ProbeRttMode *pBVar1;
  QuicPacketNumber least_unacked_packet;
  Bbr2Params *pBVar2;
  Bbr2Mode local_136;
  Bbr2Mode local_135;
  Bbr2Mode local_134;
  bool local_133;
  bool local_132;
  bool local_131;
  int local_b4;
  Bbr2Mode next_mode;
  int mode_changes_allowed;
  undefined1 local_a8 [8];
  Bbr2CongestionEvent congestion_event;
  LostPacketVector *lost_packets_local;
  AckedPacketVector *acked_packets_local;
  QuicByteCount prior_in_flight_local;
  bool param_1_local;
  Bbr2Sender *this_local;
  QuicTime event_time_local;
  
  congestion_event.last_packet_send_state.bytes_in_flight = (QuicByteCount)lost_packets;
  Bbr2CongestionEvent::Bbr2CongestionEvent((Bbr2CongestionEvent *)local_a8);
  congestion_event.event_time.time_ = this->cwnd_;
  congestion_event.prior_cwnd = prior_in_flight;
  if (this->mode_ == STARTUP) {
    local_131 = Bbr2StartupMode::IsProbingForBandwidth(&this->startup_);
  }
  else {
    if (this->mode_ == PROBE_BW) {
      local_132 = Bbr2ProbeBwMode::IsProbingForBandwidth(&this->probe_bw_);
    }
    else {
      if (this->mode_ == DRAIN) {
        local_133 = Bbr2DrainMode::IsProbingForBandwidth(&this->drain_);
      }
      else {
        pBVar1 = probe_rtt_or_die(this);
        local_133 = Bbr2ProbeRttMode::IsProbingForBandwidth(pBVar1);
      }
      local_132 = local_133;
    }
    local_131 = local_132;
  }
  congestion_event.bytes_lost._2_1_ = local_131;
  Bbr2NetworkModel::OnCongestionEventStart
            (&this->model_,event_time,acked_packets,
             (LostPacketVector *)congestion_event.last_packet_send_state.bytes_in_flight,
             (Bbr2CongestionEvent *)local_a8);
  local_b4 = 4;
  do {
    if (this->mode_ == STARTUP) {
      local_134 = Bbr2StartupMode::OnCongestionEvent
                            (&this->startup_,prior_in_flight,event_time,acked_packets,
                             (LostPacketVector *)
                             congestion_event.last_packet_send_state.bytes_in_flight,
                             (Bbr2CongestionEvent *)local_a8);
    }
    else {
      if (this->mode_ == PROBE_BW) {
        local_135 = Bbr2ProbeBwMode::OnCongestionEvent
                              (&this->probe_bw_,prior_in_flight,event_time,acked_packets,
                               (LostPacketVector *)
                               congestion_event.last_packet_send_state.bytes_in_flight,
                               (Bbr2CongestionEvent *)local_a8);
      }
      else {
        if (this->mode_ == DRAIN) {
          local_136 = Bbr2DrainMode::OnCongestionEvent
                                (&this->drain_,prior_in_flight,event_time,acked_packets,
                                 (LostPacketVector *)
                                 congestion_event.last_packet_send_state.bytes_in_flight,
                                 (Bbr2CongestionEvent *)local_a8);
        }
        else {
          pBVar1 = probe_rtt_or_die(this);
          local_136 = Bbr2ProbeRttMode::OnCongestionEvent
                                (pBVar1,prior_in_flight,event_time,acked_packets,
                                 (LostPacketVector *)
                                 congestion_event.last_packet_send_state.bytes_in_flight,
                                 (Bbr2CongestionEvent *)local_a8);
        }
        local_135 = local_136;
      }
      local_134 = local_135;
    }
    if (local_134 == this->mode_) break;
    if (this->mode_ == STARTUP) {
      Bbr2StartupMode::Leave(&this->startup_,event_time,(Bbr2CongestionEvent *)local_a8);
    }
    else if (this->mode_ == PROBE_BW) {
      Bbr2ProbeBwMode::Leave(&this->probe_bw_,event_time,(Bbr2CongestionEvent *)local_a8);
    }
    else if (this->mode_ == DRAIN) {
      Bbr2DrainMode::Leave(&this->drain_,event_time,(Bbr2CongestionEvent *)local_a8);
    }
    else {
      pBVar1 = probe_rtt_or_die(this);
      Bbr2ProbeRttMode::Leave(pBVar1,event_time,(Bbr2CongestionEvent *)local_a8);
    }
    this->mode_ = local_134;
    if (this->mode_ == STARTUP) {
      Bbr2StartupMode::Enter(&this->startup_,event_time,(Bbr2CongestionEvent *)local_a8);
    }
    else if (this->mode_ == PROBE_BW) {
      Bbr2ProbeBwMode::Enter(&this->probe_bw_,event_time,(Bbr2CongestionEvent *)local_a8);
    }
    else if (this->mode_ == DRAIN) {
      Bbr2DrainMode::Enter(&this->drain_,event_time,(Bbr2CongestionEvent *)local_a8);
    }
    else {
      pBVar1 = probe_rtt_or_die(this);
      Bbr2ProbeRttMode::Enter(pBVar1,event_time,(Bbr2CongestionEvent *)local_a8);
    }
    local_b4 = local_b4 + -1;
  } while (-1 < local_b4);
  UpdatePacingRate(this,congestion_event.bytes_in_flight);
  UpdateCongestionWindow(this,congestion_event.bytes_in_flight);
  least_unacked_packet = QuicUnackedPacketMap::GetLeastUnacked(this->unacked_packets_);
  Bbr2NetworkModel::OnCongestionEventFinish
            (&this->model_,least_unacked_packet,(Bbr2CongestionEvent *)local_a8);
  this->last_sample_is_app_limited_ = (bool)(congestion_event.bytes_lost._1_1_ & 1);
  if ((congestion_event.prior_bytes_in_flight == 0) &&
     (pBVar2 = params(this), (pBVar2->avoid_unnecessary_probe_rtt & 1U) != 0)) {
    OnEnterQuiescence(this,event_time);
  }
  return;
}

Assistant:

void Bbr2Sender::OnCongestionEvent(bool /*rtt_updated*/,
                                   QuicByteCount prior_in_flight,
                                   QuicTime event_time,
                                   const AckedPacketVector& acked_packets,
                                   const LostPacketVector& lost_packets) {
  /*QUIC_DVLOG(3) << this
                << " OnCongestionEvent. prior_in_flight:" << prior_in_flight
                << " prior_cwnd:" << cwnd_ << "  @ " << event_time;*/
  Bbr2CongestionEvent congestion_event;
  congestion_event.prior_cwnd = cwnd_;
  congestion_event.prior_bytes_in_flight = prior_in_flight;
  congestion_event.is_probing_for_bandwidth =
      BBR2_MODE_DISPATCH(IsProbingForBandwidth());

  model_.OnCongestionEventStart(event_time, acked_packets, lost_packets,
                                &congestion_event);

  // Number of mode changes allowed for this congestion event.
  int mode_changes_allowed = kMaxModeChangesPerCongestionEvent;
  while (true) {
    Bbr2Mode next_mode = BBR2_MODE_DISPATCH(
        OnCongestionEvent(prior_in_flight, event_time, acked_packets,
                          lost_packets, congestion_event));

    if (next_mode == mode_) {
      break;
    }

    //QUIC_DVLOG(2) << this << " Mode change:  " << mode_ << " ==> " << next_mode
    //              << "  @ " << event_time;
    BBR2_MODE_DISPATCH(Leave(event_time, &congestion_event));
    mode_ = next_mode;
    BBR2_MODE_DISPATCH(Enter(event_time, &congestion_event));
    --mode_changes_allowed;
    if (mode_changes_allowed < 0) {
    //  QUIC_BUG << "Exceeded max number of mode changes per congestion event.";
      break;
    }
  }

  UpdatePacingRate(congestion_event.bytes_acked);
  //QUIC_BUG_IF(pacing_rate_.IsZero()) << "Pacing rate must not be zero!";

  UpdateCongestionWindow(congestion_event.bytes_acked);
  //QUIC_BUG_IF(cwnd_ == 0u) << "Congestion window must not be zero!";

  model_.OnCongestionEventFinish(unacked_packets_->GetLeastUnacked(),
                                 congestion_event);
  last_sample_is_app_limited_ = congestion_event.last_sample_is_app_limited;
  if (congestion_event.bytes_in_flight == 0 &&
      params().avoid_unnecessary_probe_rtt) {
    OnEnterQuiescence(event_time);
  }

  //QUIC_DVLOG(3)
  //    << this << " END CongestionEvent(acked:" << acked_packets
  //    << ", lost:" << lost_packets.size() << ") "
  //    << ", Mode:" << mode_ << ", RttCount:" << model_.RoundTripCount()
  //    << ", BytesInFlight:" << congestion_event.bytes_in_flight
  //    << ", PacingRate:" << PacingRate(0) << ", CWND:" << GetCongestionWindow()
  //    << ", PacingGain:" << model_.pacing_gain()
  //    << ", CwndGain:" << model_.cwnd_gain()
  //    << ", BandwidthEstimate(kbps):" << BandwidthEstimate().ToKBitsPerSecond()
  //    << ", MinRTT(us):" << model_.MinRtt().ToMicroseconds()
  //    << ", BDP:" << model_.BDP(BandwidthEstimate())
  //    << ", BandwidthLatest(kbps):"
  //    << model_.bandwidth_latest().ToKBitsPerSecond()
  //    << ", BandwidthLow(kbps):" << model_.bandwidth_lo().ToKBitsPerSecond()
  //    << ", BandwidthHigh(kbps):" << model_.MaxBandwidth().ToKBitsPerSecond()
  //    << ", InflightLatest:" << model_.inflight_latest()
  //    << ", InflightLow:" << model_.inflight_lo()
  //    << ", InflightHigh:" << model_.inflight_hi()
  //    << ", TotalAcked:" << model_.total_bytes_acked()
  //    << ", TotalLost:" << model_.total_bytes_lost()
  //    << ", TotalSent:" << model_.total_bytes_sent() << "  @ " << event_time;
}